

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O1

DdNode * cuddZddUnateProduct(DdManager *dd,DdNode *f,DdNode *g)

{
  DdHalfWord v;
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *n;
  DdNode *n_00;
  DdNode *f_00;
  DdNode *g1;
  DdNode *g0;
  DdNode *f1;
  DdNode *f0;
  DdNode *local_88;
  DdNode *local_50;
  DdNode *local_48;
  DdNode *local_40;
  DdNode *local_38 [7];
  
  do {
    f_00 = f;
    f = g;
    pDVar2 = dd->zero;
    if (pDVar2 == f || pDVar2 == f_00) {
      return pDVar2;
    }
    if (dd->one == f_00) {
      return f;
    }
    if (dd->one == f) {
      return f_00;
    }
    g = f_00;
  } while (dd->permZ[f->index] < dd->permZ[f_00->index]);
  pDVar2 = cuddCacheLookup2Zdd(dd,cuddZddUnateProduct,f_00,f);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  v = f_00->index;
  iVar1 = cuddZddGetCofactors2(dd,f_00,v,&local_40,local_38);
  if (iVar1 != 0) {
    return (DdNode *)0x0;
  }
  Cudd_Ref(local_40);
  Cudd_Ref(local_38[0]);
  iVar1 = cuddZddGetCofactors2(dd,f,v,&local_50,&local_48);
  if (iVar1 != 0) {
    Cudd_RecursiveDerefZdd(dd,local_40);
    pDVar2 = local_38[0];
    goto LAB_007fb3f2;
  }
  Cudd_Ref(local_50);
  local_88 = local_48;
  Cudd_Ref(local_48);
  pDVar2 = cuddZddUnateProduct(dd,local_40,local_50);
  if (pDVar2 == (DdNode *)0x0) {
    Cudd_RecursiveDerefZdd(dd,local_40);
    Cudd_RecursiveDerefZdd(dd,local_38[0]);
  }
  else {
    Cudd_Ref(pDVar2);
    pDVar3 = cuddZddUnateProduct(dd,local_40,local_48);
    if (pDVar3 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,local_40);
      Cudd_RecursiveDerefZdd(dd,local_38[0]);
      Cudd_RecursiveDerefZdd(dd,local_50);
      Cudd_RecursiveDerefZdd(dd,local_48);
      goto LAB_007fb3f2;
    }
    Cudd_Ref(pDVar3);
    n = cuddZddUnateProduct(dd,local_38[0],local_50);
    if (n == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,local_40);
      Cudd_RecursiveDerefZdd(dd,local_38[0]);
      Cudd_RecursiveDerefZdd(dd,local_50);
      Cudd_RecursiveDerefZdd(dd,local_48);
      Cudd_RecursiveDerefZdd(dd,pDVar2);
      pDVar2 = pDVar3;
      goto LAB_007fb3f2;
    }
    Cudd_Ref(n);
    n_00 = cuddZddUnateProduct(dd,local_38[0],local_48);
    if (n_00 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,local_40);
      Cudd_RecursiveDerefZdd(dd,local_38[0]);
      Cudd_RecursiveDerefZdd(dd,local_50);
      Cudd_RecursiveDerefZdd(dd,local_48);
      Cudd_RecursiveDerefZdd(dd,pDVar2);
      Cudd_RecursiveDerefZdd(dd,pDVar3);
      pDVar2 = n;
      goto LAB_007fb3f2;
    }
    Cudd_Ref(n_00);
    Cudd_RecursiveDerefZdd(dd,local_40);
    Cudd_RecursiveDerefZdd(dd,local_38[0]);
    Cudd_RecursiveDerefZdd(dd,local_50);
    Cudd_RecursiveDerefZdd(dd,local_48);
    local_88 = cuddZddUnion(dd,pDVar2,pDVar3);
    if (local_88 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,pDVar2);
      Cudd_RecursiveDerefZdd(dd,pDVar3);
      Cudd_RecursiveDerefZdd(dd,n);
      pDVar2 = n_00;
      goto LAB_007fb3f2;
    }
    Cudd_Ref(local_88);
    Cudd_RecursiveDerefZdd(dd,pDVar2);
    Cudd_RecursiveDerefZdd(dd,pDVar3);
    pDVar2 = cuddZddUnion(dd,local_88,n);
    if (pDVar2 != (DdNode *)0x0) {
      Cudd_Ref(pDVar2);
      Cudd_RecursiveDerefZdd(dd,local_88);
      Cudd_RecursiveDerefZdd(dd,n);
      pDVar3 = cuddZddGetNode(dd,v,pDVar2,n_00);
      if (pDVar3 != (DdNode *)0x0) {
        Cudd_Ref(pDVar3);
        Cudd_RecursiveDerefZdd(dd,pDVar2);
        Cudd_RecursiveDerefZdd(dd,n_00);
        cuddCacheInsert2(dd,cuddZddUnateProduct,f_00,f,pDVar3);
        Cudd_Deref(pDVar3);
        return pDVar3;
      }
      Cudd_RecursiveDerefZdd(dd,n_00);
      goto LAB_007fb3f2;
    }
    Cudd_RecursiveDerefZdd(dd,n);
    local_50 = n_00;
  }
  Cudd_RecursiveDerefZdd(dd,local_50);
  pDVar2 = local_88;
LAB_007fb3f2:
  Cudd_RecursiveDerefZdd(dd,pDVar2);
  return (DdNode *)0x0;
}

Assistant:

DdNode  *
cuddZddUnateProduct(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    int         v, top_f, top_g;
    DdNode      *term1, *term2, *term3, *term4;
    DdNode      *sum1, *sum2;
    DdNode      *f0, *f1, *g0, *g1;
    DdNode      *r;
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = DD_ZERO(dd);
    int         flag;

    statLine(dd);
    if (f == zero || g == zero)
        return(zero);
    if (f == one)
        return(g);
    if (g == one)
        return(f);

    top_f = dd->permZ[f->index];
    top_g = dd->permZ[g->index];

    if (top_f > top_g)
        return(cuddZddUnateProduct(dd, g, f));

    /* Check cache */
    r = cuddCacheLookup2Zdd(dd, cuddZddUnateProduct, f, g);
    if (r)
        return(r);

    v = f->index;       /* either yi or zi */
    flag = cuddZddGetCofactors2(dd, f, v, &f1, &f0);
    if (flag == 1)
        return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    flag = cuddZddGetCofactors2(dd, g, v, &g1, &g0);
    if (flag == 1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        return(NULL);
    }
    Cudd_Ref(g1);
    Cudd_Ref(g0);

    term1 = cuddZddUnateProduct(dd, f1, g1);
    if (term1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        return(NULL);
    }
    Cudd_Ref(term1);
    term2 = cuddZddUnateProduct(dd, f1, g0);
    if (term2 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, term1);
        return(NULL);
    }
    Cudd_Ref(term2);
    term3 = cuddZddUnateProduct(dd, f0, g1);
    if (term3 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        return(NULL);
    }
    Cudd_Ref(term3);
    term4 = cuddZddUnateProduct(dd, f0, g0);
    if (term4 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        Cudd_RecursiveDerefZdd(dd, term3);
        return(NULL);
    }
    Cudd_Ref(term4);
    Cudd_RecursiveDerefZdd(dd, f1);
    Cudd_RecursiveDerefZdd(dd, f0);
    Cudd_RecursiveDerefZdd(dd, g1);
    Cudd_RecursiveDerefZdd(dd, g0);
    sum1 = cuddZddUnion(dd, term1, term2);
    if (sum1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        Cudd_RecursiveDerefZdd(dd, term3);
        Cudd_RecursiveDerefZdd(dd, term4);
        return(NULL);
    }
    Cudd_Ref(sum1);
    Cudd_RecursiveDerefZdd(dd, term1);
    Cudd_RecursiveDerefZdd(dd, term2);
    sum2 = cuddZddUnion(dd, sum1, term3);
    if (sum2 == NULL) {
        Cudd_RecursiveDerefZdd(dd, term3);
        Cudd_RecursiveDerefZdd(dd, term4);
        Cudd_RecursiveDerefZdd(dd, sum1);
        return(NULL);
    }
    Cudd_Ref(sum2);
    Cudd_RecursiveDerefZdd(dd, sum1);
    Cudd_RecursiveDerefZdd(dd, term3);
    r = cuddZddGetNode(dd, v, sum2, term4);
    if (r == NULL) {
        Cudd_RecursiveDerefZdd(dd, term4);
        Cudd_RecursiveDerefZdd(dd, sum2);
        return(NULL);
    }
    Cudd_Ref(r);
    Cudd_RecursiveDerefZdd(dd, sum2);
    Cudd_RecursiveDerefZdd(dd, term4);

    cuddCacheInsert2(dd, cuddZddUnateProduct, f, g, r);
    Cudd_Deref(r);
    return(r);

}